

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

Optional<unsigned_long> __thiscall llvm::DWARFDebugNames::Entry::getCUIndex(Entry *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong in_RCX;
  ulong extraout_RDX;
  ulong uVar4;
  bool bVar5;
  OptionalStorage<unsigned_long,_true> OVar6;
  Optional<unsigned_long> OVar7;
  undefined1 local_50 [8];
  Optional<llvm::DWARFFormValue> Off;
  
  lookup((Optional<llvm::DWARFFormValue> *)local_50,this,DW_IDX_compile_unit);
  if (Off.Storage.field_0._40_1_ == '\x01') {
    OVar6 = (OptionalStorage<unsigned_long,_true>)
            DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_50);
    in_RCX = OVar6.field_0.value >> 8;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = extraout_RDX;
    OVar6 = (OptionalStorage<unsigned_long,_true>)(auVar1 << 0x40);
  }
  if (Off.Storage.field_0._40_1_ == '\0') {
    bVar5 = (this->NameIdx->Hdr).super_HeaderPOD.CompUnitCount == 1;
    uVar4 = CONCAT71((int7)((ulong)this->NameIdx >> 8),bVar5);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    OVar6 = (OptionalStorage<unsigned_long,_true>)(auVar2 << 0x40);
    if (bVar5) {
      in_RCX = 0;
      OVar6 = (OptionalStorage<unsigned_long,_true>)(auVar3 << 0x40);
    }
  }
  OVar7.Storage._8_8_ = OVar6._8_8_;
  OVar7.Storage.field_0.value = (ulong)OVar6.field_0._0_1_ | in_RCX << 8;
  return (Optional<unsigned_long>)OVar7.Storage;
}

Assistant:

Optional<uint64_t> DWARFDebugNames::Entry::getCUIndex() const {
  if (Optional<DWARFFormValue> Off = lookup(dwarf::DW_IDX_compile_unit))
    return Off->getAsUnsignedConstant();
  // In a per-CU index, the entries without a DW_IDX_compile_unit attribute
  // implicitly refer to the single CU.
  if (NameIdx->getCUCount() == 1)
    return 0;
  return None;
}